

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops.cpp
# Opt level: O1

void ggml_compute_forward_clamp(ggml_compute_params *params,ggml_tensor *dst)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  ggml_tensor *pgVar4;
  size_t sVar5;
  size_t sVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  char *pcVar10;
  undefined8 uVar11;
  void *pvVar12;
  void *pvVar13;
  ulong uVar14;
  long lVar15;
  long lVar16;
  undefined1 auVar17 [16];
  
  pgVar4 = dst->src[0];
  uVar14 = (ulong)pgVar4->type;
  if (0x27 < uVar14) {
    return;
  }
  if (uVar14 == 0) {
    uVar1 = dst->op_params[0];
    uVar2 = dst->op_params[1];
    iVar3 = params->ith;
    lVar16 = (long)iVar3;
    lVar15 = (long)params->nth;
    iVar8 = ggml_nrows(pgVar4);
    if (dst->nb[0] == 4) {
      if (pgVar4->nb[0] == 4) {
        if (iVar8 <= iVar3) {
          return;
        }
        sVar5 = pgVar4->nb[1];
        sVar6 = dst->nb[1];
        uVar9 = (uint)pgVar4->ne[0];
        pvVar12 = (void *)(sVar6 * lVar16 + (long)dst->data);
        pvVar13 = (void *)(sVar5 * lVar16 + (long)pgVar4->data);
        do {
          if (0 < (int)uVar9) {
            uVar14 = 0;
            do {
              auVar17 = vminss_avx(ZEXT416(*(uint *)((long)pvVar13 + uVar14 * 4)),ZEXT416(uVar2));
              auVar17 = vmaxss_avx(auVar17,ZEXT416(uVar1));
              *(int *)((long)pvVar12 + uVar14 * 4) = auVar17._0_4_;
              uVar14 = uVar14 + 1;
            } while ((uVar9 & 0x7fffffff) != uVar14);
          }
          lVar16 = lVar16 + lVar15;
          pvVar12 = (void *)((long)pvVar12 + sVar6 * lVar15);
          pvVar13 = (void *)((long)pvVar13 + sVar5 * lVar15);
        } while (lVar16 < iVar8);
        return;
      }
      pcVar10 = "nb00 == sizeof(float)";
      uVar11 = 0x1318;
    }
    else {
      pcVar10 = "nb0 == sizeof(float)";
      uVar11 = 0x1317;
    }
  }
  else {
    if (uVar14 != 1) {
      if ((0x8c7fffffccU >> (uVar14 & 0x3f) & 1) == 0) {
        return;
      }
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-cpu/ops.cpp"
                 ,0x1377,"fatal error");
    }
    uVar1 = dst->op_params[0];
    uVar2 = dst->op_params[1];
    iVar3 = params->ith;
    lVar15 = (long)iVar3;
    iVar8 = params->nth;
    iVar7 = ggml_nrows(pgVar4);
    if (dst->nb[0] == 2) {
      if (pgVar4->nb[0] == 2) {
        if (iVar7 <= iVar3) {
          return;
        }
        uVar9 = (uint)pgVar4->ne[0];
        pvVar12 = (void *)(pgVar4->nb[1] * lVar15 + (long)pgVar4->data);
        do {
          if (0 < (int)uVar9) {
            uVar14 = 0;
            do {
              auVar17 = vminss_avx(ZEXT416(*(uint *)(&ggml_table_f32_f16 +
                                                    (ulong)*(ushort *)((long)pvVar12 + uVar14 * 2) *
                                                    4)),ZEXT416(uVar2));
              auVar17 = vmaxss_avx(auVar17,ZEXT416(uVar1));
              auVar17 = vcvtps2ph_f16c(auVar17,0);
              vpextrw_avx(auVar17,0);
              uVar14 = uVar14 + 1;
            } while ((uVar9 & 0x7fffffff) != uVar14);
          }
          lVar15 = lVar15 + iVar8;
          pvVar12 = (void *)((long)pvVar12 + pgVar4->nb[1] * (long)iVar8);
        } while (lVar15 < iVar7);
        return;
      }
      pcVar10 = "nb00 == sizeof(ggml_fp16_t)";
      uVar11 = 0x133c;
    }
    else {
      pcVar10 = "nb0 == sizeof(ggml_fp16_t)";
      uVar11 = 0x133b;
    }
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-cpu/ops.cpp"
             ,uVar11,"GGML_ASSERT(%s) failed",pcVar10);
}

Assistant:

void ggml_compute_forward_clamp(
        const ggml_compute_params * params,
        ggml_tensor * dst) {

    const ggml_tensor * src0 = dst->src[0];

    switch (src0->type) {
        case GGML_TYPE_F32:
            {
                ggml_compute_forward_clamp_f32(params, dst);
            } break;
        case GGML_TYPE_F16:
            {
                ggml_compute_forward_clamp_f16(params, dst);
            } break;
        case GGML_TYPE_BF16:
        case GGML_TYPE_Q4_0:
        case GGML_TYPE_Q4_1:
        case GGML_TYPE_Q5_0:
        case GGML_TYPE_Q5_1:
        case GGML_TYPE_Q8_0:
        case GGML_TYPE_Q8_1:
        case GGML_TYPE_Q2_K:
        case GGML_TYPE_Q3_K:
        case GGML_TYPE_Q4_K:
        case GGML_TYPE_Q5_K:
        case GGML_TYPE_Q6_K:
        case GGML_TYPE_TQ1_0:
        case GGML_TYPE_TQ2_0:
        case GGML_TYPE_IQ2_XXS:
        case GGML_TYPE_IQ2_XS:
        case GGML_TYPE_IQ3_XXS:
        case GGML_TYPE_IQ1_S:
        case GGML_TYPE_IQ1_M:
        case GGML_TYPE_IQ4_NL:
        case GGML_TYPE_IQ4_XS:
        case GGML_TYPE_IQ3_S:
        case GGML_TYPE_IQ2_S:
        case GGML_TYPE_Q8_K:
        case GGML_TYPE_I8:
        case GGML_TYPE_I16:
        case GGML_TYPE_I32:
        case GGML_TYPE_I64:
        case GGML_TYPE_F64:
        case GGML_TYPE_COUNT:
            {
                GGML_ABORT("fatal error");
            }
    }
}